

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O3

fdb_status
fdb_get_latency_stats(fdb_file_handle *fhandle,fdb_latency_stat *stat,fdb_latency_stat_type type)

{
  fdb_status fVar1;
  
  fVar1 = FDB_RESULT_INVALID_HANDLE;
  if ((((fhandle != (fdb_file_handle *)0x0) && (fhandle->root != (fdb_kvs_handle *)0x0)) &&
      (fVar1 = FDB_RESULT_INVALID_ARGS, type < 0x13 && stat != (fdb_latency_stat *)0x0)) &&
     (fVar1 = FDB_RESULT_FILE_NOT_OPEN, fhandle->root->file != (filemgr *)0x0)) {
    fVar1 = FDB_RESULT_SUCCESS;
  }
  return fVar1;
}

Assistant:

LIBFDB_API
fdb_status fdb_get_latency_stats(fdb_file_handle *fhandle,
                                 fdb_latency_stat *stat,
                                 fdb_latency_stat_type type)
{
    if (!fhandle || !fhandle->root) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!stat || type >= FDB_LATENCY_NUM_STATS) {
        return FDB_RESULT_INVALID_ARGS;
    }

    if (!fhandle->root->file) {
        return FDB_RESULT_FILE_NOT_OPEN;
    }

#ifdef _LATENCY_STATS
    filemgr_get_latency_stat(fhandle->root->file, type, stat);
#endif // _LATENCY_STATS

    return FDB_RESULT_SUCCESS;
}